

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spread_volatile_semantics.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::SpreadVolatileSemantics::IsTargetUsedByNonVolatileLoadInEntryPoint
          (SpreadVolatileSemantics *this,uint32_t var_id,Instruction *entry_point)

{
  bool bVar1;
  uint32_t entryId;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  funcs;
  
  entryId = Instruction::GetSingleWordInOperand(entry_point,1);
  funcs._M_h._M_buckets = &funcs._M_h._M_single_bucket;
  funcs._M_h._M_bucket_count = 1;
  funcs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  funcs._M_h._M_element_count = 0;
  funcs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  funcs._M_h._M_rehash_policy._M_next_resize = 0;
  funcs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  IRContext::CollectCallTreeFromRoots((this->super_Pass).context_,entryId,&funcs);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/spread_volatile_semantics.cpp:123:7)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/spread_volatile_semantics.cpp:123:7)>
             ::_M_manager;
  bVar1 = VisitLoadsOfPointersToVariableInEntries
                    (this,var_id,(function<bool_(spvtools::opt::Instruction_*)> *)&local_78,&funcs);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&funcs._M_h);
  return !bVar1;
}

Assistant:

bool SpreadVolatileSemantics::IsTargetUsedByNonVolatileLoadInEntryPoint(
    uint32_t var_id, Instruction* entry_point) {
  uint32_t entry_function_id =
      entry_point->GetSingleWordInOperand(kOpEntryPointInOperandEntryPoint);
  std::unordered_set<uint32_t> funcs;
  context()->CollectCallTreeFromRoots(entry_function_id, &funcs);
  return !VisitLoadsOfPointersToVariableInEntries(
      var_id,
      [](Instruction* load) {
        // If it has a load without volatile memory operand, finish traversal
        // and return false.
        if (load->NumInOperands() <= kOpLoadInOperandMemoryOperands) {
          return false;
        }
        uint32_t memory_operands =
            load->GetSingleWordInOperand(kOpLoadInOperandMemoryOperands);
        return (memory_operands & uint32_t(spv::MemoryAccessMask::Volatile)) !=
               0;
      },
      funcs);
}